

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.hpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendRowRecursive<duckdb::Value,duckdb::Value,duckdb::Value>
          (BaseAppender *this,Value *value,Value *args,Value *args_1)

{
  Value *in_RCX;
  Value *in_RDX;
  Value *in_RSI;
  undefined8 in_RDI;
  Value local_f0 [64];
  Value local_b0 [64];
  Value *in_stack_ffffffffffffff90;
  Value *in_stack_ffffffffffffff98;
  BaseAppender *in_stack_ffffffffffffffa0;
  
  duckdb::Value::Value((Value *)&stack0xffffffffffffffa0,in_RSI);
  duckdb::BaseAppender::Append<duckdb::Value>(in_RDI,(Value *)&stack0xffffffffffffffa0);
  duckdb::Value::~Value((Value *)&stack0xffffffffffffffa0);
  duckdb::Value::Value(local_b0,in_RDX);
  duckdb::Value::Value(local_f0,in_RCX);
  AppendRowRecursive<duckdb::Value,duckdb::Value>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  duckdb::Value::~Value(local_f0);
  duckdb::Value::~Value(local_b0);
  return;
}

Assistant:

void AppendRowRecursive(T value, ARGS... args) {
		Append<T>(value);
		AppendRowRecursive(args...);
	}